

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_acm.cpp
# Opt level: O3

void __thiscall intel_acm_t::header_t::~header_t(header_t *this)

{
  pointer pcVar1;
  
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__header_t_001aabe0;
  pcVar1 = (this->m_scratch_space)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_scratch_space).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_rsa_signature)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_rsa_signature).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_rsa_public_key)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_rsa_public_key).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_reserved)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_reserved).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

intel_acm_t::header_t::~header_t() {
    _clean_up();
}